

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_get_preferred_sample_rate(cubeb_conflict1 *ctx,uint32_t *rate)

{
  long lVar1;
  snd_pcm_hw_params_t *psVar2;
  snd_pcm_hw_params_t *psVar3;
  uint *puVar4;
  size_t sVar5;
  undefined8 uStack_50;
  snd_pcm_hw_params_t asStack_48 [8];
  snd_pcm_hw_params_t *local_40;
  snd_pcm_hw_params_t *local_38;
  snd_pcm_hw_params_t *hw_params;
  snd_pcm_t *pcm;
  int dir;
  int r;
  uint32_t *rate_local;
  cubeb_conflict1 *ctx_local;
  
  uStack_50 = 0x13ee99;
  _dir = rate;
  rate_local = (uint32_t *)ctx;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  lVar1 = -(sVar5 + 0xf & 0xfffffffffffffff0);
  local_40 = asStack_48 + lVar1;
  local_38 = local_40;
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13eebf;
  sVar5 = (*cubeb_snd_pcm_hw_params_sizeof)();
  psVar2 = local_40;
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13eecd;
  memset(psVar2,0,sVar5);
  *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13eee5;
  pcm._4_4_ = (*cubeb_snd_pcm_open)
                        ((snd_pcm_t **)&hw_params,"default",SND_PCM_STREAM_PLAYBACK,0x10000);
  psVar3 = hw_params;
  psVar2 = local_38;
  if (pcm._4_4_ < 0) {
    ctx_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef0b;
    pcm._4_4_ = (*cubeb_snd_pcm_hw_params_any)((snd_pcm_t *)psVar3,psVar2);
    puVar4 = _dir;
    psVar2 = local_38;
    if (pcm._4_4_ < 0) {
      *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef21;
      (*cubeb_snd_pcm_close)((snd_pcm_t *)hw_params);
      ctx_local._4_4_ = -1;
    }
    else {
      *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef42;
      pcm._4_4_ = (*cubeb_snd_pcm_hw_params_get_rate)(psVar2,puVar4,(int *)&pcm);
      puVar4 = _dir;
      psVar3 = hw_params;
      psVar2 = local_38;
      if (pcm._4_4_ < 0) {
        *_dir = 0xac44;
        *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef82;
        pcm._4_4_ = (*cubeb_snd_pcm_hw_params_set_rate_near)
                              ((snd_pcm_t *)psVar3,psVar2,puVar4,(int *)0x0);
        if (pcm._4_4_ < 0) {
          *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef98;
          (*cubeb_snd_pcm_close)((snd_pcm_t *)hw_params);
          ctx_local._4_4_ = -1;
        }
        else {
          *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13efae;
          (*cubeb_snd_pcm_close)((snd_pcm_t *)hw_params);
          ctx_local._4_4_ = 0;
        }
      }
      else {
        *(undefined8 *)(asStack_48 + lVar1 + -8) = 0x13ef58;
        (*cubeb_snd_pcm_close)((snd_pcm_t *)hw_params);
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
alsa_get_preferred_sample_rate(cubeb * ctx, uint32_t * rate) {
  (void)ctx;
  int r, dir;
  snd_pcm_t * pcm;
  snd_pcm_hw_params_t * hw_params;

  snd_pcm_hw_params_alloca(&hw_params);

  /* get a pcm, disabling resampling, so we get a rate the
   * hardware/dmix/pulse/etc. supports. */
  r = WRAP(snd_pcm_open)(&pcm, CUBEB_ALSA_PCM_NAME, SND_PCM_STREAM_PLAYBACK, SND_PCM_NO_AUTO_RESAMPLE);
  if (r < 0) {
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_any)(pcm, hw_params);
  if (r < 0) {
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_hw_params_get_rate)(hw_params, rate, &dir);
  if (r >= 0) {
    /* There is a default rate: use it. */
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_OK;
  }

  /* Use a common rate, alsa may adjust it based on hw/etc. capabilities. */
  *rate = 44100;

  r = WRAP(snd_pcm_hw_params_set_rate_near)(pcm, hw_params, rate, NULL);
  if (r < 0) {
    WRAP(snd_pcm_close)(pcm);
    return CUBEB_ERROR;
  }

  WRAP(snd_pcm_close)(pcm);

  return CUBEB_OK;
}